

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

bool __thiscall
HighsSymmetryDetection::splitCell(HighsSymmetryDetection *this,HighsInt cell,HighsInt splitPoint)

{
  pointer piVar1;
  pointer puVar2;
  pointer puVar3;
  u32 uVar4;
  u32 uVar5;
  int iVar6;
  uint *puVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  u32 certificateVal;
  uint local_30;
  HighsInt local_2c;
  
  local_2c = splitPoint;
  uVar4 = getVertexHash(this,(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[splitPoint]);
  uVar5 = getVertexHash(this,(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[cell]);
  piVar1 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = (uint)(((ulong)(uint)(splitPoint - cell) + 0x7e92251dec62835e) *
                    ((ulong)(uint)splitPoint + 0xa94e9c75f80ad6de) +
                    ((ulong)(uint)(piVar1[cell] - splitPoint) + 0x8a183895eeac1536) *
                    ((ulong)(uint)cell + 0x42d8680e260ae5b) +
                    ((ulong)uVar5 + 0x80c8963be3e4c2f3) * ((ulong)uVar4 + 0xc8497d2a400d9551) >>
                   0x20);
  puVar2 = (this->firstLeaveCertificate).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (this->firstLeaveCertificate).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    puVar3 = (this->currNodeCertificate).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->currNodeCertificate).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    iVar6 = (int)(uVar9 >> 2);
    iVar10 = (uint)(*(uint *)((long)puVar2 + uVar9) == local_30 &&
                   this->firstLeavePrefixLen == iVar6) + this->firstLeavePrefixLen;
    this->firstLeavePrefixLen = iVar10;
    puVar2 = (this->bestLeaveCertificate).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = (uint)(local_30 == *(uint *)((long)puVar2 + uVar9) && this->bestLeavePrefixLen == iVar6)
            + this->bestLeavePrefixLen;
    this->bestLeavePrefixLen = iVar8;
    if ((iVar10 <= iVar6) && (iVar8 <= iVar6)) {
      puVar7 = &local_30;
      if (iVar8 != iVar6) {
        puVar7 = puVar3 + iVar8;
      }
      if (puVar2[iVar8] < *puVar7) {
        return false;
      }
    }
  }
  piVar1[splitPoint] = piVar1[cell];
  piVar1[cell] = splitPoint;
  std::vector<int,_std::allocator<int>_>::push_back(&this->cellCreationStack,&local_2c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->currNodeCertificate,&local_30);
  return true;
}

Assistant:

bool HighsSymmetryDetection::splitCell(HighsInt cell, HighsInt splitPoint) {
  u32 hSplit = getVertexHash(currentPartition[splitPoint]);
  u32 hCell = getVertexHash(currentPartition[cell]);

  u32 certificateVal =
      (HighsHashHelpers::pair_hash<0>(hSplit, hCell) +
       HighsHashHelpers::pair_hash<1>(
           cell, currentPartitionLinks[cell] - splitPoint) +
       HighsHashHelpers::pair_hash<2>(splitPoint, splitPoint - cell)) >>
      32;

  // employ prefix pruning scheme as in bliss
  if (!firstLeaveCertificate.empty()) {
    firstLeavePrefixLen +=
        (firstLeavePrefixLen == (HighsInt)currNodeCertificate.size()) *
        (certificateVal == firstLeaveCertificate[currNodeCertificate.size()]);
    bestLeavePrefixLen +=
        (bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()) *
        (certificateVal == bestLeaveCertificate[currNodeCertificate.size()]);

    // if the node certificate is not a prefix of the first leave's certificate
    // and it comes lexicographically after the certificate value of the
    // lexicographically smallest leave certificate we prune the node
    if (firstLeavePrefixLen <= (HighsInt)currNodeCertificate.size() &&
        bestLeavePrefixLen <= (HighsInt)currNodeCertificate.size()) {
      u32 diffVal = bestLeavePrefixLen == (HighsInt)currNodeCertificate.size()
                        ? certificateVal
                        : currNodeCertificate[bestLeavePrefixLen];
      if (diffVal > bestLeaveCertificate[bestLeavePrefixLen]) return false;
    }
  }

  currentPartitionLinks[splitPoint] = currentPartitionLinks[cell];
  currentPartitionLinks[cell] = splitPoint;
  cellCreationStack.push_back(splitPoint);
  currNodeCertificate.push_back(certificateVal);

  return true;
}